

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void __thiscall arm::MultLoadStoreInst::display(MultLoadStoreInst *this,ostream *o)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  display_op((this->super_Inst).op,o);
  display_cond((this->super_Inst).cond,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
  display_reg_name(o,this->rn);
  std::__ostream_insert<char,std::char_traits<char>>(o,", {",3);
  for (p_Var1 = (this->rd)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->rd)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1 != (this->rd)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
    }
    display_reg_name(o,p_Var1[1]._M_color);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"}",1);
  return;
}

Assistant:

void MultLoadStoreInst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, rn);
  o << ", {";
  for (auto i = rd.begin(); i != rd.end(); i++) {
    if (i != rd.begin()) o << ", ";
    display_reg_name(o, *i);
  }
  o << "}";
}